

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

FFSVarRec_conflict LookupVarByName(SstStream Stream,char *Name)

{
  long lVar1;
  FFSVarRec_conflict pFVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)*Stream->ReaderMarshalData;
  if (0 < lVar5) {
    lVar1 = *(long *)((long)Stream->ReaderMarshalData + 8);
    lVar4 = 0;
    do {
      pFVar2 = *(FFSVarRec_conflict *)(lVar1 + lVar4 * 8);
      iVar3 = strcmp(pFVar2->VarName,Name);
      if (iVar3 == 0) {
        return pFVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  return (FFSVarRec_conflict)0x0;
}

Assistant:

static FFSVarRec LookupVarByName(SstStream Stream, const char *Name)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (strcmp(Info->VarList[i]->VarName, Name) == 0)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}